

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_cluster.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_output_mode(args_t *this,char *str)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  
  iVar1 = strcmp(in_RSI,"json");
  if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 0x18) = 0;
  }
  else {
    iVar1 = strcmp(in_RSI,"files");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x18) = 1;
    }
    else {
      ERROR("invalid output format mode type: %s",in_RSI);
    }
  }
  return;
}

Assistant:

void args_t::parse_output_mode( const char * str ) {
        if (!strcmp (str, "json")) {
            output_mode = json;
        } else if (!strcmp (str, "files")) {
            output_mode = files;
        } else  {
            ERROR( "invalid output format mode type: %s", str );
        }
    }